

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O2

void __thiscall Symbol_table::set_value(Symbol_table *this,string *s,double d)

{
  pointer pVVar1;
  __type _Var2;
  pointer __lhs;
  allocator<char> local_41;
  double local_40;
  string local_38;
  
  __lhs = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
          super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
          _M_start;
  pVVar1 = (this->var_table).super_vector<Variable,_std::allocator<Variable>_>.
           super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  local_40 = d;
  while( true ) {
    if (__lhs == pVVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"set: undefined name ",&local_41);
      error(&local_38,s);
      std::__cxx11::string::~string((string *)&local_38);
      return;
    }
    _Var2 = std::operator==(&__lhs->name,s);
    if (_Var2) break;
    __lhs = __lhs + 1;
  }
  if (__lhs->is_const == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"value of constant cannot be changed",&local_41);
    error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  __lhs->value = local_40;
  return;
}

Assistant:

void Symbol_table::set_value(const string& s, double d)
{
	for (auto&& var : var_table)
		if (var.name == s)
		{
			if (var.is_const)
				error("value of constant cannot be changed");
			var.value = d;
			return;
		}
	error("set: undefined name ", s);
}